

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenSwitchInsertNameAt(BinaryenExpressionRef expr,BinaryenIndex index,char *name)

{
  bool bVar1;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this;
  ulong index_00;
  string_view local_38;
  BinaryenExpressionRef local_28;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef pEStack_10;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  local_28 = expr;
  expression = (Expression *)name;
  name_local._4_4_ = index;
  pEStack_10 = expr;
  bVar1 = wasm::Expression::is<wasm::Switch>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x898,
                  "void BinaryenSwitchInsertNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if (expression != (Expression *)0x0) {
    this = (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(local_28 + 1);
    index_00 = (ulong)name_local._4_4_;
    wasm::Name::Name((Name *)&local_38,(char *)expression);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::insertAt(this,index_00,(Name)local_38);
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x899,
                "void BinaryenSwitchInsertNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
               );
}

Assistant:

void BinaryenSwitchInsertNameAt(BinaryenExpressionRef expr,
                                BinaryenIndex index,
                                const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(name);
  static_cast<Switch*>(expression)->targets.insertAt(index, name);
}